

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  generateTriangles(0x4000);
  g.draw.program =
       aGLProgramCreateSimple
                 ("uniform mat4 um4_vp, um4_model;\nuniform vec3 uv3_lightpos;\nattribute vec3 av3_pos, av3_normal, av3_color, av3_tricenter;\nvarying vec3 vv3_color;\nvoid main() {\n  vec4 pos = um4_model * vec4(av3_pos, 1.);\n  vec3 normal = (um4_model * vec4(av3_normal, 0.)).xyz;\n  vec3 ldir = uv3_lightpos - pos.xyz;  vv3_color = av3_color * max(0., dot(normalize(ldir), normal)) / dot(ldir,ldir);\n  gl_Position = um4_vp * pos;\n}"
                  ,
                  "varying vec3 vv3_color;\nvoid main() {\n  gl_FragColor = vec4(vv3_color, 1.);\n}"
                 );
  if (g.draw.program < 1) {
    aAppDebugPrintf("shader error: %s",a_gl_error);
  }
  g.attr[0].name = "av3_pos";
  g.attr[0].buffer = (AGLBuffer *)0x0;
  g.attr[0].size = 3;
  g.attr[0].type = 0x1406;
  g.attr[0].normalized = '\0';
  g.attr[0].stride = 0x30;
  g.attr[0].ptr = g.vertices;
  g.attr[2].name = "av3_normal";
  g.attr[2].buffer = (AGLBuffer *)0x0;
  g.attr[2].size = 3;
  g.attr[2].type = 0x1406;
  g.attr[2].normalized = '\0';
  g.attr[2].stride = 0x30;
  g.attr[2].ptr = &(g.vertices)->normal;
  g.attr[1].name = "av3_tricenter";
  g.attr[1].buffer = (AGLBuffer *)0x0;
  g.attr[1].size = 3;
  g.attr[1].type = 0x1406;
  g.attr[1].normalized = '\0';
  g.attr[1].stride = 0x30;
  g.attr[1].ptr = &(g.vertices)->tricenter;
  g.attr[3].name = "av3_color";
  g.attr[3].buffer = (AGLBuffer *)0x0;
  g.attr[3].size = 3;
  g.attr[3].type = 0x1406;
  g.attr[3].normalized = '\0';
  g.attr[3].stride = 0x30;
  g.attr[3].ptr = &(g.vertices)->color;
  g.pun[0].name = "um4_vp";
  g.pun[0].type = AGLAT_Mat4;
  g.pun[0].count = 1;
  g.pun[1].name = "um4_model";
  g.pun[1].type = AGLAT_Mat4;
  g.pun[1].count = 1;
  g.pun[2].name = "uv3_lightpos";
  g.pun[2].type = AGLAT_Vec3;
  g.pun[2].count = 1;
  g.draw.primitive.mode = 4;
  g.draw.primitive.count = g.vertices_count;
  g.draw.primitive.first = 0;
  g.draw.primitive.index.buffer = (AGLBuffer *)0x0;
  g.draw.primitive.index.data.ptr = (GLvoid *)0x0;
  g.draw.primitive.cull_mode = AGLCM_Front;
  g.draw.primitive.front_face = AGLFF_CounterClockwise;
  g.draw.attribs.p = g.attr;
  g.draw.attribs.n = 4;
  aGLAttributeLocate(g.draw.program,g.attr,4);
  g.draw.uniforms.p = g.pun;
  g.draw.uniforms.n = 3;
  aGLUniformLocate(g.draw.program,g.pun,3);
  g.merge.blend.enable = 0;
  g.merge.depth.mode = AGLDM_TestAndWrite;
  g.merge.depth.func = AGLDF_Less;
  return extraout_EAX;
}

Assistant:

static void init(void) {
	generateTriangles(triangles);

	g.draw.program = aGLProgramCreateSimple(shader_vertex, shader_fragment);
	if (g.draw.program <= 0) {
		aAppDebugPrintf("shader error: %s", a_gl_error);
		/* \fixme add fatal */
	}

	g.attr[VAttrPos].name = "av3_pos";
	g.attr[VAttrPos].buffer = NULL;
	g.attr[VAttrPos].size = 3;
	g.attr[VAttrPos].type = GL_FLOAT;
	g.attr[VAttrPos].normalized = GL_FALSE;
	g.attr[VAttrPos].stride = sizeof(*g.vertices);
	g.attr[VAttrPos].ptr = &g.vertices[0].pos;

	g.attr[VAttrNormal].name = "av3_normal";
	g.attr[VAttrNormal].buffer = NULL;
	g.attr[VAttrNormal].size = 3;
	g.attr[VAttrNormal].type = GL_FLOAT;
	g.attr[VAttrNormal].normalized = GL_FALSE;
	g.attr[VAttrNormal].stride = sizeof(*g.vertices);
	g.attr[VAttrNormal].ptr = &g.vertices[0].normal;

	g.attr[VAttrTriCenter].name = "av3_tricenter";
	g.attr[VAttrTriCenter].buffer = NULL;
	g.attr[VAttrTriCenter].size = 3;
	g.attr[VAttrTriCenter].type = GL_FLOAT;
	g.attr[VAttrTriCenter].normalized = GL_FALSE;
	g.attr[VAttrTriCenter].stride = sizeof(*g.vertices);
	g.attr[VAttrTriCenter].ptr = &g.vertices[0].tricenter;

	g.attr[VAttrColor].name = "av3_color";
	g.attr[VAttrColor].buffer = NULL;
	g.attr[VAttrColor].size = 3;
	g.attr[VAttrColor].type = GL_FLOAT;
	g.attr[VAttrColor].normalized = GL_FALSE;
	g.attr[VAttrColor].stride = sizeof(*g.vertices);
	g.attr[VAttrColor].ptr = &g.vertices[0].color;

	g.pun[VUniVP].name = "um4_vp";
	g.pun[VUniVP].type = AGLAT_Mat4;
	g.pun[VUniVP].count = 1;

	g.pun[VUniModel].name = "um4_model";
	g.pun[VUniModel].type = AGLAT_Mat4;
	g.pun[VUniModel].count = 1;

	g.pun[VUniLightDir].name = "uv3_lightpos";
	g.pun[VUniLightDir].type = AGLAT_Vec3;
	g.pun[VUniLightDir].count = 1;

	g.draw.primitive.mode = GL_TRIANGLES;
	g.draw.primitive.count = g.vertices_count;
	g.draw.primitive.first = 0;
	g.draw.primitive.index.buffer = NULL;
	g.draw.primitive.index.data.ptr = NULL;
	g.draw.primitive.cull_mode = AGLCM_Front;
	g.draw.primitive.front_face = AGLFF_CounterClockwise;

	g.draw.attribs.p = g.attr;
	g.draw.attribs.n = sizeof g.attr / sizeof *g.attr;

	aGLAttributeLocate(g.draw.program, g.attr, g.draw.attribs.n);

	g.draw.uniforms.p = g.pun;
	g.draw.uniforms.n = sizeof g.pun / sizeof *g.pun;

	aGLUniformLocate(g.draw.program, g.pun, g.draw.uniforms.n);

	g.merge.blend.enable = 0;
	g.merge.depth.mode = AGLDM_TestAndWrite;
	g.merge.depth.func = AGLDF_Less;
}